

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-watcher-cross-stop.c
# Opt level: O0

int run_test_watcher_cross_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  char *local_468;
  char *local_460;
  undefined1 local_458 [8];
  rlimit lim;
  char big_string [1024];
  undefined1 local_40 [8];
  uv_buf_t buf;
  sockaddr_in addr;
  uint i;
  uv_loop_t *loop;
  
  puVar2 = uv_default_loop();
  local_458 = (undefined1  [8])0x9e4;
  lim.rlim_cur = 0x9e4;
  iVar1 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)local_458);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)((long)&buf.len + 4));
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
              ,0x4f,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
      abort();
    }
    memset(&lim.rlim_max,0x41,0x400);
    uVar3 = uv_buf_init((char *)&lim.rlim_max,0x400);
    local_468 = uVar3.base;
    local_40 = (undefined1  [8])local_468;
    local_460 = (char *)uVar3.len;
    buf.base = local_460;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    for (; (uint)addr.sin_zero._0_4_ < 0x9c4; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
      iVar1 = uv_udp_init(puVar2,sockets + (uint)addr.sin_zero._0_4_);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
                ,0x54,"0 == uv_udp_init(loop, &sockets[i])");
        abort();
      }
      iVar1 = uv_udp_bind(sockets + (uint)addr.sin_zero._0_4_,(sockaddr *)((long)&buf.len + 4),4);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
                ,0x57,
                "0 == uv_udp_bind(&sockets[i], (const struct sockaddr*) &addr, UV_UDP_REUSEADDR)");
        abort();
      }
      iVar1 = uv_udp_recv_start(sockets + (uint)addr.sin_zero._0_4_,alloc_cb,recv_cb);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
                ,0x58,"0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb)");
        abort();
      }
      iVar1 = uv_udp_send(reqs + (uint)addr.sin_zero._0_4_,sockets + (uint)addr.sin_zero._0_4_,
                          (uv_buf_t *)local_40,1,(sockaddr *)((long)&buf.len + 4),send_cb);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
                ,0x5e,
                "0 == uv_udp_send(&reqs[i], &sockets[i], &buf, 1, (const struct sockaddr*) &addr, send_cb)"
               );
        abort();
      }
    }
    while (recv_cb_called == 0) {
      uv_run(puVar2,UV_RUN_ONCE);
    }
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    for (; (uint)addr.sin_zero._0_4_ < 0x9c4; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
      uv_close((uv_handle_t *)(sockets + (uint)addr.sin_zero._0_4_),close_cb);
    }
    if (recv_cb_called == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
              ,0x67,"recv_cb_called > 0");
      abort();
    }
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (send_cb_called != 0x9c4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
              ,0x6b,"ARRAY_SIZE(sockets) == send_cb_called");
      abort();
    }
    if (close_cb_called != 0x9c4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
              ,0x6c,"ARRAY_SIZE(sockets) == close_cb_called");
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
              ,0x6e,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    loop._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"%s\n","File descriptor limit too low.");
    fflush(_stderr);
    loop._4_4_ = 1;
  }
  return loop._4_4_;
}

Assistant:

TEST_IMPL(watcher_cross_stop) {
#if defined(__MVS__)
  RETURN_SKIP("zOS does not allow address or port reuse when using UDP sockets");
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned int i;
  struct sockaddr_in addr;
  uv_buf_t buf;
  char big_string[1024];

  TEST_FILE_LIMIT(ARRAY_SIZE(sockets) + 32);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  memset(big_string, 'A', sizeof(big_string));
  buf = uv_buf_init(big_string, sizeof(big_string));

  for (i = 0; i < ARRAY_SIZE(sockets); i++) {
    ASSERT(0 == uv_udp_init(loop, &sockets[i]));
    ASSERT(0 == uv_udp_bind(&sockets[i],
                            (const struct sockaddr*) &addr,
                            UV_UDP_REUSEADDR));
    ASSERT(0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb));
    ASSERT(0 == uv_udp_send(&reqs[i],
                            &sockets[i],
                            &buf,
                            1,
                            (const struct sockaddr*) &addr,
                            send_cb));
  }

  while (recv_cb_called == 0)
    uv_run(loop, UV_RUN_ONCE);

  for (i = 0; i < ARRAY_SIZE(sockets); i++)
    uv_close((uv_handle_t*) &sockets[i], close_cb);

  ASSERT(recv_cb_called > 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(sockets) == send_cb_called);
  ASSERT(ARRAY_SIZE(sockets) == close_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}